

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O0

void __thiscall MipsGenerator::GenerateStore(MipsGenerator *this,string *temp_name,string *type)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  allocator local_339;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  allocator local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  allocator local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  allocator local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  allocator local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  allocator local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  allocator local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  mapped_type local_24;
  string *psStack_20;
  int store_offset;
  string *type_local;
  string *temp_name_local;
  MipsGenerator *this_local;
  
  psStack_20 = type;
  type_local = temp_name;
  temp_name_local = (string *)this;
  bVar2 = std::operator==(type,"t");
  if (bVar2) {
    mVar1 = this->m_relative_addr;
    local_24 = mVar1;
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->m_temp2address,temp_name);
    *pmVar3 = mVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"sw ",&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"$25",&local_101);
    std::operator+(&local_a8,&local_c8,&local_100);
    std::operator+(&local_88,&local_a8," -");
    std::__cxx11::to_string(&local_128,local_24);
    std::operator+(&local_68,&local_88,&local_128);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"($sp)",&local_149);
    std::operator+(&local_48,&local_68,&local_148);
    Output2File(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    this->m_relative_addr = this->m_relative_addr + 4;
  }
  else {
    bVar2 = std::operator==(type,"g");
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f0,"sw ",&local_1f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_218,"$25",&local_219);
      std::operator+(&local_1d0,&local_1f0,&local_218);
      std::operator+(&local_1b0,&local_1d0," ");
      std::operator+(&local_190,&local_1b0,temp_name);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_240,"($28)",&local_241);
      std::operator+(&local_170,&local_190,&local_240);
      Output2File(this,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2e8,"sw ",&local_2e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_310,"$25",&local_311);
      std::operator+(&local_2c8,&local_2e8,&local_310);
      std::operator+(&local_2a8,&local_2c8," -");
      std::operator+(&local_288,&local_2a8,temp_name);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_338,"($fp)",&local_339);
      std::operator+(&local_268,&local_288,&local_338);
      Output2File(this,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    }
  }
  return;
}

Assistant:

void MipsGenerator::GenerateStore(string temp_name, string type) {
    if (type == TMP) {
        int store_offset = m_relative_addr;
        m_temp2address[temp_name] = store_offset;
        Output2File(string("sw ") + NUM1 + " -" + std::to_string(store_offset) + string("($sp)"));
        m_relative_addr += 4;
    } else if (type == GLOBAL) {
        Output2File(string("sw ") + NUM1 + " " + temp_name + string("($28)"));
    } else {
        Output2File(string("sw ") + NUM1 + " -" + temp_name + string("($fp)"));
    }
}